

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

cf_errno_t cf_que_enqueue(cf_que_t *que,cf_void_t *data,cf_size_t size)

{
  uint uVar1;
  cf_bool_t cVar2;
  cf_que_item_t *pcVar3;
  cf_errno_t cVar4;
  
  if (size == 0 || (data == (cf_void_t *)0x0 || que == (cf_que_t *)0x0)) {
    cVar4 = 2;
  }
  else {
    uVar1 = que->tail;
    cVar2 = que->empty;
    if ((cVar2 == 0) && (uVar1 == que->head)) {
      cVar4 = 5;
    }
    else {
      pcVar3 = que->items;
      pcVar3[uVar1].size = size;
      pcVar3[uVar1].data = data;
      cVar4 = 0;
      que->tail = (cf_uint_t)((ulong)(uVar1 + 1) % que->max_size);
      if (cVar2 == 1) {
        que->empty = 0;
        return cVar4;
      }
    }
  }
  return cVar4;
}

Assistant:

cf_errno_t  cf_que_enqueue(cf_que_t* que, cf_void_t* data, cf_size_t size) {
    if(!que || !data || size == 0) return CF_EPARAM;
    /* full */
    if(que->empty == CF_FALSE && que->tail == que->head) return CF_EFULL;

    que->items[que->tail].size = size;
    que->items[que->tail].data = data;

    que->tail = (que->tail + 1) % que->max_size;

    if(que->empty == CF_TRUE) que->empty = CF_FALSE;
    return CF_OK;
}